

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

float __thiscall nv::BSplineFilter::evaluate(BSplineFilter *this,float x)

{
  float fVar1;
  
  fVar1 = ABS(x);
  if (1.0 <= fVar1) {
    if (2.0 <= fVar1) {
      return 0.0;
    }
    fVar1 = 2.0 - fVar1;
    fVar1 = fVar1 * fVar1 * fVar1;
  }
  else {
    fVar1 = (fVar1 * 3.0 + -6.0) * x * x + 4.0;
  }
  return fVar1 / 6.0;
}

Assistant:

float BSplineFilter::evaluate(float x) const
{
	x = fabs(x);
    if( x < 1.0f ) return (4.0f + x * x * (-6.0f + x * 3.0f)) / 6.0f;
    if( x < 2.0f ) { 
    	float t = 2.0f - x;
    	return t * t * t / 6.0f;
    }
    return 0.0f;
}